

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  int p1;
  int p2;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vdbe *p;
  KeyInfo *zP4;
  char *zP4_00;
  Parse *local_98;
  int local_7c;
  int iParent;
  int iChild;
  int iJump;
  KeyInfo *pKey;
  int regRec;
  int regTemp_1;
  int nCol;
  int regTemp;
  int iMustBeInt;
  int iReg;
  int iOk;
  int iCur;
  Vdbe *v;
  int i;
  int *aiCol_local;
  FKey *pFKey_local;
  Index *pIdx_local;
  Table *pTab_local;
  int iDb_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  p1 = pParse->nTab + -1;
  p2 = sqlite3VdbeMakeLabel(p);
  if (nIncr < 0) {
    sqlite3VdbeAddOp2(p,0x76,(uint)pFKey->isDeferred,p2);
  }
  for (v._4_4_ = 0; v._4_4_ < pFKey->nCol; v._4_4_ = v._4_4_ + 1) {
    sqlite3VdbeAddOp2(p,0x49,aiCol[v._4_4_] + regData + 1,p2);
  }
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      iVar1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0xf,*aiCol + 1 + regData,iVar1);
      iVar2 = sqlite3VdbeAddOp2(p,0x15,iVar1,0);
      if ((pTab == pFKey->pFrom) && (nIncr == 1)) {
        sqlite3VdbeAddOp3(p,0x4c,regData,p2,iVar1);
      }
      sqlite3OpenTable(pParse,p1,iDb,pTab,0x27);
      sqlite3VdbeAddOp3(p,0x36,p1,0,iVar1);
      sqlite3VdbeAddOp2(p,1,0,p2);
      iVar3 = sqlite3VdbeCurrentAddr(p);
      sqlite3VdbeJumpHere(p,iVar3 + -2);
      sqlite3VdbeJumpHere(p,iVar2);
      sqlite3ReleaseTempReg(pParse,iVar1);
    }
    else {
      iVar1 = pFKey->nCol;
      iVar2 = sqlite3GetTempRange(pParse,iVar1);
      iVar3 = sqlite3GetTempReg(pParse);
      zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
      sqlite3VdbeAddOp3(p,0x27,p1,pIdx->tnum,iDb);
      sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0x10);
      for (v._4_4_ = 0; v._4_4_ < iVar1; v._4_4_ = v._4_4_ + 1) {
        sqlite3VdbeAddOp2(p,0xe,aiCol[v._4_4_] + 1 + regData,iVar2 + v._4_4_);
      }
      if ((pTab == pFKey->pFrom) && (nIncr == 1)) {
        iVar4 = sqlite3VdbeCurrentAddr(p);
        for (v._4_4_ = 0; v._4_4_ < iVar1; v._4_4_ = v._4_4_ + 1) {
          local_7c = pIdx->aiColumn[v._4_4_] + 1 + regData;
          if (pIdx->aiColumn[v._4_4_] == (int)pTab->iPKey) {
            local_7c = regData;
          }
          sqlite3VdbeAddOp3(p,0x4b,aiCol[v._4_4_] + 1 + regData,iVar4 + iVar1 + 1,local_7c);
          sqlite3VdbeChangeP5(p,'\b');
        }
        sqlite3VdbeAddOp2(p,1,0,p2);
      }
      sqlite3VdbeAddOp3(p,0x1f,iVar2,iVar1,iVar3);
      zP4_00 = sqlite3IndexAffinityStr(p,pIdx);
      sqlite3VdbeChangeP4(p,-1,zP4_00,0);
      sqlite3VdbeAddOp4Int(p,0x34,p1,p2,iVar3,0);
      sqlite3ReleaseTempReg(pParse,iVar3);
      sqlite3ReleaseTempRange(pParse,iVar2,iVar1);
    }
  }
  if (((pFKey->isDeferred == '\0') && (pParse->pToplevel == (Parse *)0x0)) &&
     (pParse->isMultiWrite == '\0')) {
    sqlite3HaltConstraint(pParse,0x313,2,"foreign key constraint failed",-2);
  }
  else {
    if ((0 < nIncr) && (pFKey->isDeferred == '\0')) {
      local_98 = pParse;
      if (pParse->pToplevel != (Parse *)0x0) {
        local_98 = pParse->pToplevel;
      }
      local_98->mayAbort = '\x01';
    }
    sqlite3VdbeAddOp2(p,0x75,(uint)pFKey->isDeferred,nIncr);
  }
  sqlite3VdbeResolveLabel(p,p2);
  sqlite3VdbeAddOp1(p,0x2d,p1);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(v);        /* jump here if parent key found */

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeChangeP4(v, -1, (char*)pKey, P4_KEYINFO_HANDOFF);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      }
  
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTemp, nCol, regRec);
      sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v,pIdx), P4_TRANSIENT);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, "foreign key constraint failed", P4_STATIC
    );
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3ParseToplevel(pParse)->mayAbort = 1;
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}